

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar8;
  undefined4 uVar9;
  ushort uVar10;
  ushort uVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  uint uVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  size_t sVar43;
  long lVar44;
  ulong uVar45;
  RayK<8> *pRVar46;
  bool bVar47;
  byte bVar48;
  float fVar49;
  float fVar91;
  float fVar92;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar93;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  vint4 ai;
  undefined1 auVar97 [16];
  vint4 ai_2;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  vint4 bi;
  float fVar103;
  float fVar104;
  float fVar105;
  vint4 ai_6;
  undefined1 auVar106 [16];
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  vint4 bi_8;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  vint4 bi_3;
  undefined1 auVar131 [64];
  vint4 bi_6;
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack [244];
  undefined1 local_cc1;
  uint local_cc0;
  undefined4 local_cbc;
  ulong *local_cb8;
  ulong local_cb0;
  ulong local_ca8;
  ulong local_ca0;
  ulong local_c98;
  ulong local_c90;
  ulong local_c88;
  ulong local_c80;
  ulong local_c78;
  RTCRayQueryContext *local_c70;
  uint local_c68;
  uint local_c64;
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  ulong local_bf8;
  long local_bf0;
  ulong local_be8;
  size_t local_be0;
  RayK<8> *local_bd8;
  ulong local_bd0;
  ulong local_bc8;
  long local_bc0;
  long local_bb8;
  Scene *local_bb0;
  ulong *local_ba8;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 *local_a60;
  byte local_a58;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  float local_9e0 [4];
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  uint uStack_9c4;
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  uint uStack_9a4;
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  uint uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  local_cb8 = local_7f8;
  local_800 = root.ptr;
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar133 = ZEXT1664(auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar134 = ZEXT1664(auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x40)));
  auVar135 = ZEXT1664(auVar50);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar98 * 0.99999964)));
  auVar136 = ZEXT1664(auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar49 * 0.99999964)));
  auVar137 = ZEXT1664(auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar91 * 0.99999964)));
  auVar138 = ZEXT1664(auVar50);
  fVar98 = fVar98 * 1.0000004;
  fVar49 = fVar49 * 1.0000004;
  fVar91 = fVar91 * 1.0000004;
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar40 = uVar36 ^ 0x10;
  uVar41 = uVar37 ^ 0x10;
  iVar8 = (tray->tnear).field_0.i[k];
  local_b90._4_4_ = iVar8;
  local_b90._0_4_ = iVar8;
  local_b90._8_4_ = iVar8;
  local_b90._12_4_ = iVar8;
  auVar131 = ZEXT1664(local_b90);
  iVar8 = (tray->tfar).field_0.i[k];
  local_ba0._4_4_ = iVar8;
  local_ba0._0_4_ = iVar8;
  local_ba0._8_4_ = iVar8;
  local_ba0._12_4_ = iVar8;
  auVar132 = ZEXT1664(local_ba0);
  uVar42 = uVar39 ^ 0x10;
  local_980 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar92 = fVar98;
  fVar93 = fVar98;
  fVar94 = fVar98;
  fVar95 = fVar49;
  fVar96 = fVar49;
  fVar99 = fVar49;
  fVar100 = fVar91;
  fVar101 = fVar91;
  fVar102 = fVar91;
  local_ca8 = uVar42;
  local_ca0 = uVar41;
  local_c98 = uVar40;
  local_c90 = uVar39;
  local_c88 = uVar37;
  local_c80 = uVar36;
  local_be0 = k;
  local_bd8 = ray;
  local_b80 = fVar91;
  fStack_b7c = fVar91;
  fStack_b78 = fVar91;
  fStack_b74 = fVar91;
  local_b70 = fVar49;
  fStack_b6c = fVar49;
  fStack_b68 = fVar49;
  fStack_b64 = fVar49;
  local_b60 = fVar98;
  fStack_b5c = fVar98;
  fStack_b58 = fVar98;
  fStack_b54 = fVar98;
  do {
    local_ba8 = local_cb8;
    if (local_cb8 == &local_800) break;
    uVar45 = local_cb8[-1];
    local_cb8 = local_cb8 + -1;
    do {
      if ((uVar45 & 8) == 0) {
        uVar31 = uVar45 & 0xfffffffffffffff0;
        uVar9 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar54._4_4_ = uVar9;
        auVar54._0_4_ = uVar9;
        auVar54._8_4_ = uVar9;
        auVar54._12_4_ = uVar9;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar36),auVar54,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar36));
        auVar51 = vsubps_avx512vl(auVar50,auVar133._0_16_);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar37),auVar54,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar37));
        auVar51 = vmulps_avx512vl(auVar136._0_16_,auVar51);
        auVar52 = vsubps_avx512vl(auVar50,auVar134._0_16_);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar39),auVar54,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar39));
        auVar52 = vmulps_avx512vl(auVar137._0_16_,auVar52);
        auVar50 = vsubps_avx512vl(auVar50,auVar135._0_16_);
        auVar50 = vmulps_avx512vl(auVar138._0_16_,auVar50);
        auVar50 = vmaxps_avx(auVar52,auVar50);
        auVar51 = vmaxps_avx(auVar131._0_16_,auVar51);
        auVar50 = vmaxps_avx(auVar51,auVar50);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar40),auVar54,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar40));
        auVar51 = vsubps_avx512vl(auVar51,auVar133._0_16_);
        auVar52._0_4_ = fVar98 * auVar51._0_4_;
        auVar52._4_4_ = fVar92 * auVar51._4_4_;
        auVar52._8_4_ = fVar93 * auVar51._8_4_;
        auVar52._12_4_ = fVar94 * auVar51._12_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar41),auVar54,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar41));
        auVar51 = vsubps_avx512vl(auVar51,auVar134._0_16_);
        auVar106._0_4_ = fVar49 * auVar51._0_4_;
        auVar106._4_4_ = fVar95 * auVar51._4_4_;
        auVar106._8_4_ = fVar96 * auVar51._8_4_;
        auVar106._12_4_ = fVar99 * auVar51._12_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar42),auVar54,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar42));
        auVar51 = vsubps_avx512vl(auVar51,auVar135._0_16_);
        auVar55._0_4_ = fVar91 * auVar51._0_4_;
        auVar55._4_4_ = fVar100 * auVar51._4_4_;
        auVar55._8_4_ = fVar101 * auVar51._8_4_;
        auVar55._12_4_ = fVar102 * auVar51._12_4_;
        auVar51 = vminps_avx(auVar106,auVar55);
        auVar52 = vminps_avx(auVar132._0_16_,auVar52);
        auVar51 = vminps_avx(auVar52,auVar51);
        uVar19 = vcmpps_avx512vl(auVar50,auVar51,2);
        bVar48 = (byte)uVar19;
        if (((uint)uVar45 & 7) == 6) {
          uVar19 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar31 + 0xf0),1);
          uVar20 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar31 + 0xe0),0xd);
          bVar48 = (byte)uVar19 & (byte)uVar20 & bVar48;
        }
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar48);
      }
      if ((uVar45 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar30 = 4;
        }
        else {
          uVar31 = uVar45 & 0xfffffffffffffff0;
          lVar35 = 0;
          for (uVar45 = unaff_RBX; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
            lVar35 = lVar35 + 1;
          }
          uVar30 = 0;
          for (uVar33 = unaff_RBX - 1 & unaff_RBX; uVar45 = *(ulong *)(uVar31 + lVar35 * 8),
              uVar33 != 0; uVar33 = uVar33 - 1 & uVar33) {
            *local_cb8 = uVar45;
            local_cb8 = local_cb8 + 1;
            lVar35 = 0;
            for (uVar45 = uVar33; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
              lVar35 = lVar35 + 1;
            }
          }
        }
      }
      else {
        uVar30 = 6;
      }
    } while (uVar30 == 0);
    if (uVar30 == 6) {
      local_be8 = (ulong)((uint)uVar45 & 0xf) - 8;
      bVar47 = local_be8 != 0;
      if (bVar47) {
        uVar45 = uVar45 & 0xfffffffffffffff0;
        local_bc8 = 0;
        do {
          local_bf0 = local_bc8 * 0x90;
          fVar103 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar45 + 0x80 + local_bf0)) *
                    *(float *)(uVar45 + 0x84 + local_bf0);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(uVar45 + 0x20 + local_bf0);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)(uVar45 + 0x24 + local_bf0);
          uVar19 = vpcmpub_avx512vl(auVar50,auVar64,2);
          auVar50 = vpmovzxbd_avx(auVar50);
          uVar9 = *(undefined4 *)(uVar45 + 0x44 + local_bf0);
          auVar58._4_4_ = uVar9;
          auVar58._0_4_ = uVar9;
          auVar58._8_4_ = uVar9;
          auVar58._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar45 + 0x38 + local_bf0);
          auVar63._4_4_ = uVar9;
          auVar63._0_4_ = uVar9;
          auVar63._8_4_ = uVar9;
          auVar63._12_4_ = uVar9;
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar51 = vfmadd213ps_fma(auVar50,auVar58,auVar63);
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)(uVar45 + 0x50 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar53);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar9 = *(undefined4 *)(uVar45 + 0x74 + local_bf0);
          auVar116._4_4_ = uVar9;
          auVar116._0_4_ = uVar9;
          auVar116._8_4_ = uVar9;
          auVar116._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar45 + 0x68 + local_bf0);
          auVar119._4_4_ = uVar9;
          auVar119._0_4_ = uVar9;
          auVar119._8_4_ = uVar9;
          auVar119._12_4_ = uVar9;
          auVar50 = vfmadd213ps_fma(auVar50,auVar116,auVar119);
          auVar97._4_4_ = fVar103;
          auVar97._0_4_ = fVar103;
          auVar97._8_4_ = fVar103;
          auVar97._12_4_ = fVar103;
          auVar50 = vsubps_avx(auVar50,auVar51);
          auVar51 = vfmadd213ps_fma(auVar50,auVar97,auVar51);
          auVar50 = vpmovzxbd_avx(auVar64);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar52 = vfmadd213ps_fma(auVar50,auVar58,auVar63);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)(uVar45 + 0x54 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar57);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar50 = vfmadd213ps_fma(auVar50,auVar116,auVar119);
          auVar50 = vsubps_avx(auVar50,auVar52);
          auVar52 = vfmadd213ps_fma(auVar50,auVar97,auVar52);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(uVar45 + 0x28 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar59);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar9 = *(undefined4 *)(uVar45 + 0x48 + local_bf0);
          auVar107._4_4_ = uVar9;
          auVar107._0_4_ = uVar9;
          auVar107._8_4_ = uVar9;
          auVar107._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar45 + 0x3c + local_bf0);
          auVar112._4_4_ = uVar9;
          auVar112._0_4_ = uVar9;
          auVar112._8_4_ = uVar9;
          auVar112._12_4_ = uVar9;
          auVar54 = vfmadd213ps_fma(auVar50,auVar107,auVar112);
          auVar117._8_8_ = 0;
          auVar117._0_8_ = *(ulong *)(uVar45 + 0x58 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar117);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar9 = *(undefined4 *)(uVar45 + 0x78 + local_bf0);
          auVar120._4_4_ = uVar9;
          auVar120._0_4_ = uVar9;
          auVar120._8_4_ = uVar9;
          auVar120._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar45 + 0x6c + local_bf0);
          auVar122._4_4_ = uVar9;
          auVar122._0_4_ = uVar9;
          auVar122._8_4_ = uVar9;
          auVar122._12_4_ = uVar9;
          auVar50 = vfmadd213ps_fma(auVar50,auVar120,auVar122);
          auVar50 = vsubps_avx(auVar50,auVar54);
          auVar54 = vfmadd213ps_fma(auVar50,auVar97,auVar54);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(uVar45 + 0x2c + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar60);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar106 = vfmadd213ps_fma(auVar50,auVar107,auVar112);
          auVar108._8_8_ = 0;
          auVar108._0_8_ = *(ulong *)(uVar45 + 0x5c + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar108);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar50 = vfmadd213ps_fma(auVar50,auVar120,auVar122);
          auVar50 = vsubps_avx(auVar50,auVar106);
          auVar106 = vfmadd213ps_fma(auVar50,auVar97,auVar106);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(uVar45 + 0x30 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar61);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar9 = *(undefined4 *)(uVar45 + 0x4c + local_bf0);
          auVar113._4_4_ = uVar9;
          auVar113._0_4_ = uVar9;
          auVar113._8_4_ = uVar9;
          auVar113._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar45 + 0x40 + local_bf0);
          auVar121._4_4_ = uVar9;
          auVar121._0_4_ = uVar9;
          auVar121._8_4_ = uVar9;
          auVar121._12_4_ = uVar9;
          auVar55 = vfmadd213ps_fma(auVar50,auVar113,auVar121);
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)(uVar45 + 0x60 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar123);
          uVar9 = *(undefined4 *)(uVar45 + 0x7c + local_bf0);
          auVar125._4_4_ = uVar9;
          auVar125._0_4_ = uVar9;
          auVar125._8_4_ = uVar9;
          auVar125._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar45 + 0x70 + local_bf0);
          auVar128._4_4_ = uVar9;
          auVar128._0_4_ = uVar9;
          auVar128._8_4_ = uVar9;
          auVar128._12_4_ = uVar9;
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar50 = vfmadd213ps_fma(auVar50,auVar125,auVar128);
          auVar50 = vsubps_avx(auVar50,auVar55);
          auVar55 = vfmadd213ps_fma(auVar50,auVar97,auVar55);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(uVar45 + 0x34 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar62);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar53 = vfmadd213ps_fma(auVar50,auVar113,auVar121);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)(uVar45 + 100 + local_bf0);
          auVar50 = vpmovzxbd_avx(auVar114);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar50 = vfmadd213ps_fma(auVar50,auVar125,auVar128);
          auVar50 = vsubps_avx(auVar50,auVar53);
          auVar50 = vfmadd213ps_fma(auVar50,auVar97,auVar53);
          auVar51 = vsubps_avx512vl(auVar51,auVar133._0_16_);
          auVar53 = vmulps_avx512vl(auVar136._0_16_,auVar51);
          auVar51 = vsubps_avx512vl(auVar54,auVar134._0_16_);
          auVar54 = vmulps_avx512vl(auVar137._0_16_,auVar51);
          auVar51 = vsubps_avx512vl(auVar55,auVar135._0_16_);
          auVar55 = vmulps_avx512vl(auVar138._0_16_,auVar51);
          auVar51 = vsubps_avx512vl(auVar52,auVar133._0_16_);
          auVar56._0_4_ = fVar98 * auVar51._0_4_;
          auVar56._4_4_ = fVar92 * auVar51._4_4_;
          auVar56._8_4_ = fVar93 * auVar51._8_4_;
          auVar56._12_4_ = fVar94 * auVar51._12_4_;
          auVar51 = vsubps_avx512vl(auVar106,auVar134._0_16_);
          auVar109._0_4_ = fVar49 * auVar51._0_4_;
          auVar109._4_4_ = fVar95 * auVar51._4_4_;
          auVar109._8_4_ = fVar96 * auVar51._8_4_;
          auVar109._12_4_ = fVar99 * auVar51._12_4_;
          auVar50 = vsubps_avx512vl(auVar50,auVar135._0_16_);
          auVar115._0_4_ = fVar91 * auVar50._0_4_;
          auVar115._4_4_ = fVar100 * auVar50._4_4_;
          auVar115._8_4_ = fVar101 * auVar50._8_4_;
          auVar115._12_4_ = fVar102 * auVar50._12_4_;
          auVar51 = vpminsd_avx(auVar53,auVar56);
          auVar50 = vpmaxsd_avx(auVar53,auVar56);
          auVar52 = vpminsd_avx(auVar54,auVar109);
          auVar51 = vpmaxsd_avx(auVar51,auVar52);
          auVar52 = vpmaxsd_avx(auVar54,auVar109);
          auVar54 = vpminsd_avx(auVar50,auVar52);
          auVar52 = vpminsd_avx(auVar55,auVar115);
          auVar50 = vpmaxsd_avx(auVar55,auVar115);
          auVar52 = vpmaxsd_avx(auVar52,auVar131._0_16_);
          auVar51 = vpmaxsd_avx(auVar51,auVar52);
          auVar50 = vpminsd_avx(auVar50,auVar132._0_16_);
          auVar50 = vpminsd_avx(auVar54,auVar50);
          local_bd0 = vpcmpd_avx512vl(auVar51,auVar50,2);
          local_bd0 = ((byte)uVar19 & 0xf) & local_bd0;
          if ((char)local_bd0 != '\0') {
            local_bf0 = local_bf0 + uVar45;
            sVar43 = k;
            pRVar46 = ray;
            do {
              ray = local_bd8;
              k = local_be0;
              lVar35 = 0;
              for (uVar36 = local_bd0; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
              {
                lVar35 = lVar35 + 1;
              }
              uVar10 = *(ushort *)(local_bf0 + lVar35 * 8);
              uVar11 = *(ushort *)(local_bf0 + 2 + lVar35 * 8);
              local_bf8 = (ulong)*(uint *)(local_bf0 + 4 + lVar35 * 8);
              local_bb0 = context->scene;
              pGVar12 = (local_bb0->geometries).items[*(uint *)(local_bf0 + 0x88)].ptr;
              local_bb8 = *(long *)&pGVar12->field_0x58;
              fVar98 = (pGVar12->time_range).lower;
              auVar88._4_4_ = fVar98;
              auVar88._0_4_ = fVar98;
              auVar88._8_4_ = fVar98;
              auVar88._12_4_ = fVar98;
              auVar88._16_4_ = fVar98;
              auVar88._20_4_ = fVar98;
              auVar88._24_4_ = fVar98;
              auVar88._28_4_ = fVar98;
              fVar49 = pGVar12->fnumTimeSegments;
              auVar88 = vsubps_avx(*(undefined1 (*) [32])(pRVar46 + 0xe0),auVar88);
              fVar98 = (pGVar12->time_range).upper - fVar98;
              auVar85._4_4_ = fVar98;
              auVar85._0_4_ = fVar98;
              auVar85._8_4_ = fVar98;
              auVar85._12_4_ = fVar98;
              auVar85._16_4_ = fVar98;
              auVar85._20_4_ = fVar98;
              auVar85._24_4_ = fVar98;
              auVar85._28_4_ = fVar98;
              auVar88 = vdivps_avx(auVar88,auVar85);
              auVar89._4_4_ = fVar49 * auVar88._4_4_;
              auVar89._0_4_ = fVar49 * auVar88._0_4_;
              auVar89._8_4_ = fVar49 * auVar88._8_4_;
              auVar89._12_4_ = fVar49 * auVar88._12_4_;
              auVar89._16_4_ = fVar49 * auVar88._16_4_;
              auVar89._20_4_ = fVar49 * auVar88._20_4_;
              auVar89._24_4_ = fVar49 * auVar88._24_4_;
              auVar89._28_4_ = auVar88._28_4_;
              auVar88 = vroundps_avx(auVar89,1);
              fVar49 = fVar49 + -1.0;
              auVar67._4_4_ = fVar49;
              auVar67._0_4_ = fVar49;
              auVar67._8_4_ = fVar49;
              auVar67._12_4_ = fVar49;
              auVar67._16_4_ = fVar49;
              auVar67._20_4_ = fVar49;
              auVar67._24_4_ = fVar49;
              auVar67._28_4_ = fVar49;
              auVar88 = vminps_avx(auVar88,auVar67);
              auVar88 = vmaxps_avx(auVar88,_DAT_02020f00);
              local_940 = vsubps_avx(auVar89,auVar88);
              local_960 = vcvtps2dq_avx(auVar88);
              local_bc0 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                          _M_i * local_bf8;
              local_c64 = uVar10 & 0x7fff;
              local_c68 = uVar11 & 0x7fff;
              uVar30 = *(uint *)(local_bb8 + 4 + local_bc0);
              uVar39 = (ulong)uVar30;
              uVar37 = (ulong)(uVar30 * local_c68 + *(int *)(local_bb8 + local_bc0) + local_c64);
              lVar13 = *(long *)&pGVar12[2].numPrimitives;
              lVar34 = (long)*(int *)(local_960 + sVar43 * 4) * 0x38;
              lVar14 = *(long *)(lVar13 + 0x10 + lVar34);
              lVar15 = *(long *)(lVar13 + lVar34);
              auVar50 = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar37);
              lVar16 = *(long *)(lVar13 + 0x48 + lVar34);
              auVar51 = *(undefined1 (*) [16])(lVar15 + (uVar37 + 1) * lVar14);
              lVar35 = uVar37 + uVar39;
              auVar52 = *(undefined1 (*) [16])(lVar15 + lVar35 * lVar14);
              lVar32 = uVar37 + uVar39 + 1;
              auVar54 = *(undefined1 (*) [16])(lVar15 + lVar32 * lVar14);
              lVar38 = uVar37 + (-1 < (short)uVar10) + 1;
              auVar106 = *(undefined1 (*) [16])(lVar15 + lVar38 * lVar14);
              lVar44 = (ulong)(-1 < (short)uVar10) + lVar32;
              auVar55 = *(undefined1 (*) [16])(lVar15 + lVar44 * lVar14);
              uVar36 = 0;
              if (-1 < (short)uVar11) {
                uVar36 = uVar39;
              }
              auVar53 = *(undefined1 (*) [16])(lVar15 + (lVar35 + uVar36) * lVar14);
              auVar97 = *(undefined1 (*) [16])(lVar15 + (lVar32 + uVar36) * lVar14);
              auVar64 = *(undefined1 (*) [16])(lVar15 + lVar14 * (uVar36 + lVar44));
              lVar13 = *(long *)(lVar13 + 0x38 + lVar34);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_940 + local_be0 * 4)));
              auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * uVar37),auVar50);
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar56,auVar50);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * (uVar37 + 1)),auVar51);
              auVar58 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar51);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar35),auVar52);
              auVar59 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar52);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar32),auVar54);
              auVar60 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar54);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar38),auVar106);
              auVar51 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar106);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar44),auVar55);
              auVar61 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar55);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * (lVar35 + uVar36)),
                                   auVar53);
              auVar62 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar53);
              auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + lVar16 * (lVar32 + uVar36)),
                                        auVar97);
              auVar63 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar97);
              auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + (uVar36 + lVar44) * lVar16),
                                        auVar64);
              auVar64 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar64);
              auVar52 = vunpcklps_avx(auVar58,auVar61);
              auVar50 = vunpckhps_avx(auVar58,auVar61);
              auVar54 = vunpcklps_avx(auVar51,auVar60);
              auVar51 = vunpckhps_avx(auVar51,auVar60);
              auVar106 = vunpcklps_avx(auVar50,auVar51);
              auVar55 = vunpcklps_avx(auVar52,auVar54);
              auVar50 = vunpckhps_avx(auVar52,auVar54);
              auVar54 = vunpcklps_avx(auVar59,auVar63);
              auVar51 = vunpckhps_avx(auVar59,auVar63);
              auVar53 = vunpcklps_avx(auVar60,auVar62);
              auVar52 = vunpckhps_avx(auVar60,auVar62);
              auVar52 = vunpcklps_avx(auVar51,auVar52);
              auVar97 = vunpcklps_avx(auVar54,auVar53);
              auVar51 = vunpckhps_avx(auVar54,auVar53);
              auVar72._16_16_ = auVar63;
              auVar72._0_16_ = auVar59;
              auVar70._16_16_ = auVar61;
              auVar70._0_16_ = auVar58;
              auVar88 = vunpcklps_avx(auVar70,auVar72);
              auVar77._16_16_ = auVar60;
              auVar77._0_16_ = auVar57;
              auVar74._16_16_ = auVar64;
              auVar74._0_16_ = auVar60;
              auVar89 = vunpcklps_avx(auVar77,auVar74);
              auVar67 = vunpcklps_avx(auVar89,auVar88);
              auVar89 = vunpckhps_avx(auVar89,auVar88);
              auVar88 = vunpckhps_avx(auVar70,auVar72);
              auVar85 = vunpckhps_avx(auVar77,auVar74);
              auVar85 = vunpcklps_avx(auVar85,auVar88);
              auVar73._16_16_ = auVar55;
              auVar73._0_16_ = auVar55;
              auVar75._16_16_ = auVar50;
              auVar75._0_16_ = auVar50;
              auVar76._16_16_ = auVar106;
              auVar76._0_16_ = auVar106;
              auVar78._16_16_ = auVar97;
              auVar78._0_16_ = auVar97;
              auVar79._16_16_ = auVar51;
              auVar79._0_16_ = auVar51;
              uVar9 = *(undefined4 *)(local_bd8 + local_be0 * 4);
              auVar80._4_4_ = uVar9;
              auVar80._0_4_ = uVar9;
              auVar80._8_4_ = uVar9;
              auVar80._12_4_ = uVar9;
              auVar80._16_4_ = uVar9;
              auVar80._20_4_ = uVar9;
              auVar80._24_4_ = uVar9;
              auVar80._28_4_ = uVar9;
              uVar9 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x20);
              auVar83._4_4_ = uVar9;
              auVar83._0_4_ = uVar9;
              auVar83._8_4_ = uVar9;
              auVar83._12_4_ = uVar9;
              auVar83._16_4_ = uVar9;
              auVar83._20_4_ = uVar9;
              auVar83._24_4_ = uVar9;
              auVar83._28_4_ = uVar9;
              auVar65 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_bd8 + local_be0 * 4 + 0x40)));
              uVar9 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x80);
              auVar118._4_4_ = uVar9;
              auVar118._0_4_ = uVar9;
              auVar118._8_4_ = uVar9;
              auVar118._12_4_ = uVar9;
              auVar118._16_4_ = uVar9;
              auVar118._20_4_ = uVar9;
              auVar118._24_4_ = uVar9;
              auVar118._28_4_ = uVar9;
              auVar66 = vinsertf32x4_avx512vl(ZEXT1632(auVar52),auVar52,1);
              uVar9 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0xa0);
              auVar126._4_4_ = uVar9;
              auVar126._0_4_ = uVar9;
              auVar126._8_4_ = uVar9;
              auVar126._12_4_ = uVar9;
              auVar126._16_4_ = uVar9;
              auVar126._20_4_ = uVar9;
              auVar126._24_4_ = uVar9;
              auVar126._28_4_ = uVar9;
              fVar98 = *(float *)(local_bd8 + local_be0 * 4 + 0xc0);
              auVar129._4_4_ = fVar98;
              auVar129._0_4_ = fVar98;
              auVar129._8_4_ = fVar98;
              auVar129._12_4_ = fVar98;
              auVar129._16_4_ = fVar98;
              auVar129._20_4_ = fVar98;
              auVar129._24_4_ = fVar98;
              auVar129._28_4_ = fVar98;
              auVar88 = vsubps_avx(auVar67,auVar80);
              auVar89 = vsubps_avx(auVar89,auVar83);
              auVar67 = vsubps_avx512vl(auVar85,auVar65);
              auVar85 = vsubps_avx(auVar73,auVar80);
              auVar68 = vsubps_avx512vl(auVar75,auVar83);
              auVar69 = vsubps_avx512vl(auVar76,auVar65);
              auVar70 = vsubps_avx512vl(auVar78,auVar80);
              auVar71 = vsubps_avx512vl(auVar79,auVar83);
              auVar65 = vsubps_avx512vl(auVar66,auVar65);
              auVar72 = vsubps_avx512vl(auVar70,auVar88);
              auVar73 = vsubps_avx512vl(auVar71,auVar89);
              auVar74 = vsubps_avx512vl(auVar65,auVar67);
              auVar75 = vsubps_avx512vl(auVar88,auVar85);
              auVar76 = vsubps_avx512vl(auVar89,auVar68);
              auVar77 = vsubps_avx512vl(auVar67,auVar69);
              auVar78 = vsubps_avx512vl(auVar85,auVar70);
              auVar79 = vsubps_avx512vl(auVar68,auVar71);
              auVar80 = vsubps_avx512vl(auVar69,auVar65);
              auVar66 = vaddps_avx512vl(auVar70,auVar88);
              auVar81 = vaddps_avx512vl(auVar71,auVar89);
              auVar82 = vaddps_avx512vl(auVar65,auVar67);
              auVar83 = vmulps_avx512vl(auVar81,auVar74);
              auVar83 = vfmsub231ps_avx512vl(auVar83,auVar73,auVar82);
              auVar82 = vmulps_avx512vl(auVar82,auVar72);
              auVar84 = vfmsub231ps_avx512vl(auVar82,auVar74,auVar66);
              auVar82._4_4_ = auVar66._4_4_ * auVar73._4_4_;
              auVar82._0_4_ = auVar66._0_4_ * auVar73._0_4_;
              auVar82._8_4_ = auVar66._8_4_ * auVar73._8_4_;
              auVar82._12_4_ = auVar66._12_4_ * auVar73._12_4_;
              auVar82._16_4_ = auVar66._16_4_ * auVar73._16_4_;
              auVar82._20_4_ = auVar66._20_4_ * auVar73._20_4_;
              auVar82._24_4_ = auVar66._24_4_ * auVar73._24_4_;
              auVar82._28_4_ = auVar66._28_4_;
              auVar50 = vfmsub231ps_fma(auVar82,auVar72,auVar81);
              auVar124._0_4_ = auVar50._0_4_ * fVar98;
              auVar124._4_4_ = auVar50._4_4_ * fVar98;
              auVar124._8_4_ = auVar50._8_4_ * fVar98;
              auVar124._12_4_ = auVar50._12_4_ * fVar98;
              auVar124._16_4_ = fVar98 * 0.0;
              auVar124._20_4_ = fVar98 * 0.0;
              auVar124._24_4_ = fVar98 * 0.0;
              auVar124._28_4_ = 0;
              auVar66 = vfmadd231ps_avx512vl(auVar124,auVar126,auVar84);
              auVar82 = vfmadd231ps_avx512vl(auVar66,auVar118,auVar83);
              auVar130._0_4_ = auVar88._0_4_ + auVar85._0_4_;
              auVar130._4_4_ = auVar88._4_4_ + auVar85._4_4_;
              auVar130._8_4_ = auVar88._8_4_ + auVar85._8_4_;
              auVar130._12_4_ = auVar88._12_4_ + auVar85._12_4_;
              auVar130._16_4_ = auVar88._16_4_ + auVar85._16_4_;
              auVar130._20_4_ = auVar88._20_4_ + auVar85._20_4_;
              auVar130._24_4_ = auVar88._24_4_ + auVar85._24_4_;
              auVar130._28_4_ = auVar88._28_4_ + auVar85._28_4_;
              auVar66 = vaddps_avx512vl(auVar89,auVar68);
              auVar81 = vaddps_avx512vl(auVar67,auVar69);
              auVar83 = vmulps_avx512vl(auVar66,auVar77);
              auVar83 = vfmsub231ps_avx512vl(auVar83,auVar76,auVar81);
              auVar81 = vmulps_avx512vl(auVar81,auVar75);
              auVar84 = vfmsub231ps_avx512vl(auVar81,auVar77,auVar130);
              auVar81 = vmulps_avx512vl(auVar130,auVar76);
              auVar66 = vfmsub231ps_avx512vl(auVar81,auVar75,auVar66);
              auVar81._4_4_ = auVar66._4_4_ * fVar98;
              auVar81._0_4_ = auVar66._0_4_ * fVar98;
              auVar81._8_4_ = auVar66._8_4_ * fVar98;
              auVar81._12_4_ = auVar66._12_4_ * fVar98;
              auVar81._16_4_ = auVar66._16_4_ * fVar98;
              auVar81._20_4_ = auVar66._20_4_ * fVar98;
              auVar81._24_4_ = auVar66._24_4_ * fVar98;
              auVar81._28_4_ = auVar66._28_4_;
              auVar66 = vfmadd231ps_avx512vl(auVar81,auVar126,auVar84);
              auVar81 = vfmadd231ps_avx512vl(auVar66,auVar118,auVar83);
              auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar85 = vaddps_avx512vl(auVar85,auVar70);
              auVar66 = vaddps_avx512vl(auVar68,auVar71);
              auVar65 = vaddps_avx512vl(auVar69,auVar65);
              auVar68 = vmulps_avx512vl(auVar66,auVar80);
              auVar70 = vfmsub231ps_avx512vl(auVar68,auVar79,auVar65);
              auVar68._4_4_ = auVar65._4_4_ * auVar78._4_4_;
              auVar68._0_4_ = auVar65._0_4_ * auVar78._0_4_;
              auVar68._8_4_ = auVar65._8_4_ * auVar78._8_4_;
              auVar68._12_4_ = auVar65._12_4_ * auVar78._12_4_;
              auVar68._16_4_ = auVar65._16_4_ * auVar78._16_4_;
              auVar68._20_4_ = auVar65._20_4_ * auVar78._20_4_;
              auVar68._24_4_ = auVar65._24_4_ * auVar78._24_4_;
              auVar68._28_4_ = auVar65._28_4_;
              auVar50 = vfmsub231ps_fma(auVar68,auVar80,auVar85);
              auVar69._4_4_ = auVar85._4_4_ * auVar79._4_4_;
              auVar69._0_4_ = auVar85._0_4_ * auVar79._0_4_;
              auVar69._8_4_ = auVar85._8_4_ * auVar79._8_4_;
              auVar69._12_4_ = auVar85._12_4_ * auVar79._12_4_;
              auVar69._16_4_ = auVar85._16_4_ * auVar79._16_4_;
              auVar69._20_4_ = auVar85._20_4_ * auVar79._20_4_;
              auVar69._24_4_ = auVar85._24_4_ * auVar79._24_4_;
              auVar69._28_4_ = auVar85._28_4_;
              auVar85 = vfmsub231ps_avx512vl(auVar69,auVar78,auVar66);
              auVar85 = vmulps_avx512vl(auVar85,auVar129);
              auVar85 = vfmadd231ps_avx512vl(auVar85,auVar126,ZEXT1632(auVar50));
              auVar85 = vfmadd231ps_avx512vl(auVar85,auVar118,auVar70);
              auVar71._0_4_ = auVar82._0_4_ + auVar81._0_4_;
              auVar71._4_4_ = auVar82._4_4_ + auVar81._4_4_;
              auVar71._8_4_ = auVar82._8_4_ + auVar81._8_4_;
              auVar71._12_4_ = auVar82._12_4_ + auVar81._12_4_;
              auVar71._16_4_ = auVar82._16_4_ + auVar81._16_4_;
              auVar71._20_4_ = auVar82._20_4_ + auVar81._20_4_;
              auVar71._24_4_ = auVar82._24_4_ + auVar81._24_4_;
              auVar71._28_4_ = auVar82._28_4_ + auVar81._28_4_;
              local_a80 = vaddps_avx512vl(auVar85,auVar71);
              vandps_avx512vl(local_a80,auVar83);
              auVar65._8_4_ = 0x34000000;
              auVar65._0_8_ = 0x3400000034000000;
              auVar65._12_4_ = 0x34000000;
              auVar65._16_4_ = 0x34000000;
              auVar65._20_4_ = 0x34000000;
              auVar65._24_4_ = 0x34000000;
              auVar65._28_4_ = 0x34000000;
              auVar65 = vmulps_avx512vl(local_a80,auVar65);
              auVar66 = vminps_avx512vl(auVar82,auVar81);
              auVar68 = vminps_avx512vl(auVar66,auVar85);
              auVar66._8_4_ = 0x80000000;
              auVar66._0_8_ = 0x8000000080000000;
              auVar66._12_4_ = 0x80000000;
              auVar66._16_4_ = 0x80000000;
              auVar66._20_4_ = 0x80000000;
              auVar66._24_4_ = 0x80000000;
              auVar66._28_4_ = 0x80000000;
              auVar66 = vxorps_avx512vl(auVar65,auVar66);
              uVar19 = vcmpps_avx512vl(auVar68,auVar66,5);
              auVar66 = vmaxps_avx512vl(auVar82,auVar81);
              auVar85 = vmaxps_avx512vl(auVar66,auVar85);
              uVar20 = vcmpps_avx512vl(auVar85,auVar65,2);
              local_a58 = (byte)uVar19 | (byte)uVar20;
              uVar36 = local_c80;
              uVar37 = local_c88;
              uVar39 = local_c90;
              uVar40 = local_c98;
              uVar41 = local_ca0;
              uVar42 = local_ca8;
              if (local_a58 != 0) {
                auVar85 = vmulps_avx512vl(auVar76,auVar74);
                auVar65 = vmulps_avx512vl(auVar72,auVar77);
                auVar66 = vmulps_avx512vl(auVar75,auVar73);
                auVar68 = vmulps_avx512vl(auVar79,auVar77);
                auVar69 = vmulps_avx512vl(auVar75,auVar80);
                auVar70 = vmulps_avx512vl(auVar78,auVar76);
                auVar71 = vfmsub213ps_avx512vl(auVar73,auVar77,auVar85);
                auVar73 = vfmsub213ps_avx512vl(auVar74,auVar75,auVar65);
                auVar72 = vfmsub213ps_avx512vl(auVar72,auVar76,auVar66);
                auVar74 = vfmsub213ps_avx512vl(auVar80,auVar76,auVar68);
                auVar77 = vfmsub213ps_avx512vl(auVar78,auVar77,auVar69);
                auVar75 = vfmsub213ps_avx512vl(auVar79,auVar75,auVar70);
                vandps_avx512vl(auVar85,auVar83);
                vandps_avx512vl(auVar68,auVar83);
                uVar31 = vcmpps_avx512vl(auVar75,auVar75,1);
                vandps_avx512vl(auVar65,auVar83);
                vandps_avx512vl(auVar69,auVar83);
                uVar33 = vcmpps_avx512vl(auVar75,auVar75,1);
                vandps_avx512vl(auVar66,auVar83);
                vandps_avx512vl(auVar70,auVar83);
                uVar21 = vcmpps_avx512vl(auVar75,auVar75,1);
                bVar18 = (bool)((byte)uVar31 & 1);
                auVar86._0_4_ =
                     (float)((uint)bVar18 * auVar71._0_4_ | (uint)!bVar18 * auVar74._0_4_);
                bVar18 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar86._4_4_ =
                     (float)((uint)bVar18 * auVar71._4_4_ | (uint)!bVar18 * auVar74._4_4_);
                bVar18 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar86._8_4_ =
                     (float)((uint)bVar18 * auVar71._8_4_ | (uint)!bVar18 * auVar74._8_4_);
                bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar86._12_4_ =
                     (float)((uint)bVar18 * auVar71._12_4_ | (uint)!bVar18 * auVar74._12_4_);
                bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                auVar86._16_4_ =
                     (float)((uint)bVar18 * auVar71._16_4_ | (uint)!bVar18 * auVar74._16_4_);
                bVar18 = (bool)((byte)(uVar31 >> 5) & 1);
                auVar86._20_4_ =
                     (float)((uint)bVar18 * auVar71._20_4_ | (uint)!bVar18 * auVar74._20_4_);
                bVar18 = (bool)((byte)(uVar31 >> 6) & 1);
                auVar86._24_4_ =
                     (float)((uint)bVar18 * auVar71._24_4_ | (uint)!bVar18 * auVar74._24_4_);
                bVar18 = SUB81(uVar31 >> 7,0);
                auVar86._28_4_ = (uint)bVar18 * auVar71._28_4_ | (uint)!bVar18 * auVar74._28_4_;
                bVar18 = (bool)((byte)uVar33 & 1);
                auVar87._0_4_ =
                     (float)((uint)bVar18 * auVar73._0_4_ | (uint)!bVar18 * auVar77._0_4_);
                bVar18 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar87._4_4_ =
                     (float)((uint)bVar18 * auVar73._4_4_ | (uint)!bVar18 * auVar77._4_4_);
                bVar18 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar87._8_4_ =
                     (float)((uint)bVar18 * auVar73._8_4_ | (uint)!bVar18 * auVar77._8_4_);
                bVar18 = (bool)((byte)(uVar33 >> 3) & 1);
                auVar87._12_4_ =
                     (float)((uint)bVar18 * auVar73._12_4_ | (uint)!bVar18 * auVar77._12_4_);
                bVar18 = (bool)((byte)(uVar33 >> 4) & 1);
                auVar87._16_4_ =
                     (float)((uint)bVar18 * auVar73._16_4_ | (uint)!bVar18 * auVar77._16_4_);
                bVar18 = (bool)((byte)(uVar33 >> 5) & 1);
                auVar87._20_4_ =
                     (float)((uint)bVar18 * auVar73._20_4_ | (uint)!bVar18 * auVar77._20_4_);
                bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                auVar87._24_4_ =
                     (float)((uint)bVar18 * auVar73._24_4_ | (uint)!bVar18 * auVar77._24_4_);
                bVar18 = SUB81(uVar33 >> 7,0);
                auVar87._28_4_ = (uint)bVar18 * auVar73._28_4_ | (uint)!bVar18 * auVar77._28_4_;
                bVar18 = (bool)((byte)uVar21 & 1);
                fVar49 = (float)((uint)bVar18 * auVar72._0_4_ | (uint)!bVar18 * auVar75._0_4_);
                bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
                fVar91 = (float)((uint)bVar18 * auVar72._4_4_ | (uint)!bVar18 * auVar75._4_4_);
                bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
                fVar92 = (float)((uint)bVar18 * auVar72._8_4_ | (uint)!bVar18 * auVar75._8_4_);
                bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
                fVar93 = (float)((uint)bVar18 * auVar72._12_4_ | (uint)!bVar18 * auVar75._12_4_);
                bVar18 = (bool)((byte)(uVar21 >> 4) & 1);
                fVar94 = (float)((uint)bVar18 * auVar72._16_4_ | (uint)!bVar18 * auVar75._16_4_);
                bVar18 = (bool)((byte)(uVar21 >> 5) & 1);
                fVar95 = (float)((uint)bVar18 * auVar72._20_4_ | (uint)!bVar18 * auVar75._20_4_);
                bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
                fVar96 = (float)((uint)bVar18 * auVar72._24_4_ | (uint)!bVar18 * auVar75._24_4_);
                bVar18 = SUB81(uVar21 >> 7,0);
                auVar25._4_4_ = fVar98 * fVar91;
                auVar25._0_4_ = fVar98 * fVar49;
                auVar25._8_4_ = fVar98 * fVar92;
                auVar25._12_4_ = fVar98 * fVar93;
                auVar25._16_4_ = fVar98 * fVar94;
                auVar25._20_4_ = fVar98 * fVar95;
                auVar25._24_4_ = fVar98 * fVar96;
                auVar25._28_4_ = fVar98;
                auVar50 = vfmadd213ps_fma(auVar126,auVar87,auVar25);
                auVar50 = vfmadd213ps_fma(auVar118,auVar86,ZEXT1632(auVar50));
                auVar85 = ZEXT1632(CONCAT412(auVar50._12_4_ + auVar50._12_4_,
                                             CONCAT48(auVar50._8_4_ + auVar50._8_4_,
                                                      CONCAT44(auVar50._4_4_ + auVar50._4_4_,
                                                               auVar50._0_4_ + auVar50._0_4_))));
                auVar127._0_4_ = auVar67._0_4_ * fVar49;
                auVar127._4_4_ = auVar67._4_4_ * fVar91;
                auVar127._8_4_ = auVar67._8_4_ * fVar92;
                auVar127._12_4_ = auVar67._12_4_ * fVar93;
                auVar127._16_4_ = auVar67._16_4_ * fVar94;
                auVar127._20_4_ = auVar67._20_4_ * fVar95;
                auVar127._24_4_ = auVar67._24_4_ * fVar96;
                auVar127._28_4_ = 0;
                auVar50 = vfmadd213ps_fma(auVar89,auVar87,auVar127);
                auVar51 = vfmadd213ps_fma(auVar88,auVar86,ZEXT1632(auVar50));
                auVar88 = vrcp14ps_avx512vl(auVar85);
                auVar84._8_4_ = 0x3f800000;
                auVar84._0_8_ = &DAT_3f8000003f800000;
                auVar84._12_4_ = 0x3f800000;
                auVar84._16_4_ = 0x3f800000;
                auVar84._20_4_ = 0x3f800000;
                auVar84._24_4_ = 0x3f800000;
                auVar84._28_4_ = 0x3f800000;
                auVar89 = vfnmadd213ps_avx512vl(auVar88,auVar85,auVar84);
                auVar50 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
                local_a00 = ZEXT1632(CONCAT412(auVar50._12_4_ * (auVar51._12_4_ + auVar51._12_4_),
                                               CONCAT48(auVar50._8_4_ *
                                                        (auVar51._8_4_ + auVar51._8_4_),
                                                        CONCAT44(auVar50._4_4_ *
                                                                 (auVar51._4_4_ + auVar51._4_4_),
                                                                 auVar50._0_4_ *
                                                                 (auVar51._0_4_ + auVar51._0_4_)))))
                ;
                uVar9 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x60);
                auVar22._4_4_ = uVar9;
                auVar22._0_4_ = uVar9;
                auVar22._8_4_ = uVar9;
                auVar22._12_4_ = uVar9;
                auVar22._16_4_ = uVar9;
                auVar22._20_4_ = uVar9;
                auVar22._24_4_ = uVar9;
                auVar22._28_4_ = uVar9;
                uVar19 = vcmpps_avx512vl(local_a00,auVar22,0xd);
                uVar9 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x100);
                auVar23._4_4_ = uVar9;
                auVar23._0_4_ = uVar9;
                auVar23._8_4_ = uVar9;
                auVar23._12_4_ = uVar9;
                auVar23._16_4_ = uVar9;
                auVar23._20_4_ = uVar9;
                auVar23._24_4_ = uVar9;
                auVar23._28_4_ = uVar9;
                uVar20 = vcmpps_avx512vl(local_a00,auVar23,2);
                local_a58 = (byte)uVar19 & (byte)uVar20 & local_a58;
                if (local_a58 != 0) {
                  uVar19 = vcmpps_avx512vl(auVar85,_DAT_02020f00,4);
                  local_a58 = local_a58 & (byte)uVar19;
                  if (local_a58 != 0) {
                    local_a60 = &local_cc1;
                    auVar88 = vsubps_avx(local_a80,auVar81);
                    auVar88 = vblendps_avx(auVar82,auVar88,0xf0);
                    auVar89 = vsubps_avx(local_a80,auVar82);
                    auVar89 = vblendps_avx(auVar81,auVar89,0xf0);
                    local_9e0[0] = auVar86._0_4_ * 1.0;
                    local_9e0[1] = auVar86._4_4_ * 1.0;
                    local_9e0[2] = auVar86._8_4_ * 1.0;
                    local_9e0[3] = auVar86._12_4_ * 1.0;
                    fStack_9d0 = auVar86._16_4_ * -1.0;
                    fStack_9cc = auVar86._20_4_ * -1.0;
                    fStack_9c8 = auVar86._24_4_ * -1.0;
                    uStack_9c4 = auVar86._28_4_;
                    local_9c0[0] = auVar87._0_4_ * 1.0;
                    local_9c0[1] = auVar87._4_4_ * 1.0;
                    local_9c0[2] = auVar87._8_4_ * 1.0;
                    local_9c0[3] = auVar87._12_4_ * 1.0;
                    fStack_9b0 = auVar87._16_4_ * -1.0;
                    fStack_9ac = auVar87._20_4_ * -1.0;
                    fStack_9a8 = auVar87._24_4_ * -1.0;
                    uStack_9a4 = auVar87._28_4_;
                    local_9a0[0] = fVar49 * 1.0;
                    local_9a0[1] = fVar91 * 1.0;
                    local_9a0[2] = fVar92 * 1.0;
                    local_9a0[3] = fVar93 * 1.0;
                    fStack_990 = fVar94 * -1.0;
                    fStack_98c = fVar95 * -1.0;
                    fStack_988 = fVar96 * -1.0;
                    uStack_984 = (uint)bVar18 * auVar72._28_4_ | (uint)!bVar18 * auVar75._28_4_;
                    auVar85 = vpbroadcastd_avx512vl();
                    auVar85 = vpaddd_avx2(auVar85,_DAT_0205d4c0);
                    auVar65 = vpbroadcastd_avx512vl();
                    auVar65 = vpaddd_avx2(auVar65,_DAT_0205d4e0);
                    auVar110._0_4_ = (float)(int)(*(ushort *)(local_bb8 + 8 + local_bc0) - 1);
                    auVar110._4_12_ = auVar67._4_12_;
                    auVar51._12_4_ = 0;
                    auVar51._0_12_ = ZEXT812(0);
                    auVar52 = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)auVar110._0_4_));
                    auVar50 = vfnmadd213ss_fma(auVar110,auVar52,SUB6416(ZEXT464(0x40000000),0));
                    fVar98 = auVar52._0_4_ * auVar50._0_4_;
                    auVar50 = vcvtsi2ss_avx512f(auVar76._0_16_,
                                                *(ushort *)(local_bb8 + 10 + local_bc0) - 1);
                    auVar51 = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416(auVar50._0_4_));
                    auVar50 = vfnmadd213ss_fma(auVar50,auVar51,SUB6416(ZEXT464(0x40000000),0));
                    fVar49 = auVar51._0_4_ * auVar50._0_4_;
                    auVar85 = vcvtdq2ps_avx(auVar85);
                    fVar99 = auVar85._28_4_ + auVar88._28_4_;
                    fVar91 = (local_a80._0_4_ * auVar85._0_4_ + auVar88._0_4_) * fVar98;
                    fVar92 = (local_a80._4_4_ * auVar85._4_4_ + auVar88._4_4_) * fVar98;
                    local_ac0._4_4_ = fVar92;
                    local_ac0._0_4_ = fVar91;
                    fVar93 = (local_a80._8_4_ * auVar85._8_4_ + auVar88._8_4_) * fVar98;
                    local_ac0._8_4_ = fVar93;
                    fVar94 = (local_a80._12_4_ * auVar85._12_4_ + auVar88._12_4_) * fVar98;
                    local_ac0._12_4_ = fVar94;
                    fVar95 = (local_a80._16_4_ * auVar85._16_4_ + auVar88._16_4_) * fVar98;
                    local_ac0._16_4_ = fVar95;
                    fVar96 = (local_a80._20_4_ * auVar85._20_4_ + auVar88._20_4_) * fVar98;
                    local_ac0._20_4_ = fVar96;
                    fVar98 = (local_a80._24_4_ * auVar85._24_4_ + auVar88._24_4_) * fVar98;
                    local_ac0._24_4_ = fVar98;
                    local_ac0._28_4_ = fVar99;
                    auVar88 = vcvtdq2ps_avx(auVar65);
                    fVar100 = (local_a80._0_4_ * auVar88._0_4_ + auVar89._0_4_) * fVar49;
                    fVar101 = (local_a80._4_4_ * auVar88._4_4_ + auVar89._4_4_) * fVar49;
                    local_aa0._4_4_ = fVar101;
                    local_aa0._0_4_ = fVar100;
                    fVar102 = (local_a80._8_4_ * auVar88._8_4_ + auVar89._8_4_) * fVar49;
                    local_aa0._8_4_ = fVar102;
                    fVar103 = (local_a80._12_4_ * auVar88._12_4_ + auVar89._12_4_) * fVar49;
                    local_aa0._12_4_ = fVar103;
                    fVar104 = (local_a80._16_4_ * auVar88._16_4_ + auVar89._16_4_) * fVar49;
                    local_aa0._16_4_ = fVar104;
                    fVar105 = (local_a80._20_4_ * auVar88._20_4_ + auVar89._20_4_) * fVar49;
                    local_aa0._20_4_ = fVar105;
                    fVar49 = (local_a80._24_4_ * auVar88._24_4_ + auVar89._24_4_) * fVar49;
                    local_aa0._24_4_ = fVar49;
                    local_aa0._28_4_ = auVar88._28_4_ + auVar89._28_4_;
                    pGVar12 = (local_bb0->geometries).items[*(uint *)(local_bf0 + 0x88)].ptr;
                    if ((pGVar12->mask & *(uint *)(local_bd8 + local_be0 * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_008094d1:
                        auVar131 = ZEXT1664(local_b90);
                        auVar132 = ZEXT1664(local_ba0);
                        fVar98 = local_b60;
                        fVar92 = fStack_b5c;
                        fVar93 = fStack_b58;
                        fVar94 = fStack_b54;
                        fVar49 = local_b70;
                        fVar95 = fStack_b6c;
                        fVar96 = fStack_b68;
                        fVar99 = fStack_b64;
                        fVar91 = local_b80;
                        fVar100 = fStack_b7c;
                        fVar101 = fStack_b78;
                        fVar102 = fStack_b74;
                        goto LAB_008094fe;
                      }
                      auVar24._8_4_ = 0x219392ef;
                      auVar24._0_8_ = 0x219392ef219392ef;
                      auVar24._12_4_ = 0x219392ef;
                      auVar24._16_4_ = 0x219392ef;
                      auVar24._20_4_ = 0x219392ef;
                      auVar24._24_4_ = 0x219392ef;
                      auVar24._28_4_ = 0x219392ef;
                      uVar31 = vcmpps_avx512vl(local_a80,auVar24,5);
                      auVar88 = vrcp14ps_avx512vl(local_a80);
                      auVar111._8_4_ = 0x3f800000;
                      auVar111._0_8_ = &DAT_3f8000003f800000;
                      auVar111._12_4_ = 0x3f800000;
                      auVar111._16_4_ = 0x3f800000;
                      auVar111._20_4_ = 0x3f800000;
                      auVar111._24_4_ = 0x3f800000;
                      auVar111._28_4_ = 0x3f800000;
                      auVar50 = vfnmadd213ps_fma(local_a80,auVar88,auVar111);
                      auVar88 = vfmadd132ps_avx512vl(ZEXT1632(auVar50),auVar88,auVar88);
                      fVar1 = (float)((uint)((byte)uVar31 & 1) * auVar88._0_4_);
                      fVar2 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar88._4_4_);
                      fVar3 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar88._8_4_);
                      fVar4 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar88._12_4_);
                      fVar5 = (float)((uint)((byte)(uVar31 >> 4) & 1) * auVar88._16_4_);
                      fVar6 = (float)((uint)((byte)(uVar31 >> 5) & 1) * auVar88._20_4_);
                      fVar7 = (float)((uint)((byte)(uVar31 >> 6) & 1) * auVar88._24_4_);
                      auVar26._4_4_ = fVar92 * fVar2;
                      auVar26._0_4_ = fVar91 * fVar1;
                      auVar26._8_4_ = fVar93 * fVar3;
                      auVar26._12_4_ = fVar94 * fVar4;
                      auVar26._16_4_ = fVar95 * fVar5;
                      auVar26._20_4_ = fVar96 * fVar6;
                      auVar26._24_4_ = fVar98 * fVar7;
                      auVar26._28_4_ = fVar99;
                      local_a40 = vminps_avx(auVar26,auVar111);
                      auVar27._4_4_ = fVar101 * fVar2;
                      auVar27._0_4_ = fVar100 * fVar1;
                      auVar27._8_4_ = fVar102 * fVar3;
                      auVar27._12_4_ = fVar103 * fVar4;
                      auVar27._16_4_ = fVar104 * fVar5;
                      auVar27._20_4_ = fVar105 * fVar6;
                      auVar27._24_4_ = fVar49 * fVar7;
                      auVar27._28_4_ = (uint)(byte)(uVar31 >> 7) * auVar88._28_4_;
                      local_a20 = vminps_avx(auVar27,auVar111);
                      local_c78 = (ulong)local_a58;
                      local_cc0 = (uint)CONCAT11((char)(uVar10 >> 8),local_c78 == 0);
                      if (local_c78 != 0) {
                        local_cb0 = 0;
                        for (uVar31 = local_c78; (uVar31 & 1) == 0;
                            uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                          local_cb0 = local_cb0 + 1;
                        }
                        local_b00 = vpbroadcastd_avx512vl();
                        local_b20 = vpbroadcastd_avx512vl();
                        local_c10 = auVar133._0_16_;
                        local_c20 = auVar134._0_16_;
                        local_c30 = auVar135._0_16_;
                        local_c40 = auVar136._0_16_;
                        local_c50 = auVar137._0_16_;
                        local_c60 = auVar138._0_16_;
                        do {
                          local_cbc = *(undefined4 *)(ray + k * 4 + 0x100);
                          uVar9 = *(undefined4 *)(local_a40 + local_cb0 * 4);
                          local_8c0._4_4_ = uVar9;
                          local_8c0._0_4_ = uVar9;
                          local_8c0._8_4_ = uVar9;
                          local_8c0._12_4_ = uVar9;
                          local_8c0._16_4_ = uVar9;
                          local_8c0._20_4_ = uVar9;
                          local_8c0._24_4_ = uVar9;
                          local_8c0._28_4_ = uVar9;
                          uVar9 = *(undefined4 *)(local_a20 + local_cb0 * 4);
                          local_8a0._4_4_ = uVar9;
                          local_8a0._0_4_ = uVar9;
                          local_8a0._8_4_ = uVar9;
                          local_8a0._12_4_ = uVar9;
                          local_8a0._16_4_ = uVar9;
                          local_8a0._20_4_ = uVar9;
                          local_8a0._24_4_ = uVar9;
                          local_8a0._28_4_ = uVar9;
                          *(float *)(ray + k * 4 + 0x100) = local_9e0[local_cb0 - 8];
                          local_c70 = context->user;
                          local_920 = local_9e0[local_cb0];
                          fVar98 = local_9c0[local_cb0];
                          local_900._4_4_ = fVar98;
                          local_900._0_4_ = fVar98;
                          local_900._8_4_ = fVar98;
                          local_900._12_4_ = fVar98;
                          local_900._16_4_ = fVar98;
                          local_900._20_4_ = fVar98;
                          local_900._24_4_ = fVar98;
                          local_900._28_4_ = fVar98;
                          fVar98 = local_9a0[local_cb0];
                          local_8e0._4_4_ = fVar98;
                          local_8e0._0_4_ = fVar98;
                          local_8e0._8_4_ = fVar98;
                          local_8e0._12_4_ = fVar98;
                          local_8e0._16_4_ = fVar98;
                          local_8e0._20_4_ = fVar98;
                          local_8e0._24_4_ = fVar98;
                          local_8e0._28_4_ = fVar98;
                          fStack_91c = local_920;
                          fStack_918 = local_920;
                          fStack_914 = local_920;
                          fStack_910 = local_920;
                          fStack_90c = local_920;
                          fStack_908 = local_920;
                          fStack_904 = local_920;
                          local_880 = local_b20._0_8_;
                          uStack_878 = local_b20._8_8_;
                          uStack_870 = local_b20._16_8_;
                          uStack_868 = local_b20._24_8_;
                          local_860 = local_b00;
                          vpcmpeqd_avx2(local_b00,local_b00);
                          uStack_83c = local_c70->instID[0];
                          local_840 = uStack_83c;
                          uStack_838 = uStack_83c;
                          uStack_834 = uStack_83c;
                          uStack_830 = uStack_83c;
                          uStack_82c = uStack_83c;
                          uStack_828 = uStack_83c;
                          uStack_824 = uStack_83c;
                          uStack_81c = local_c70->instPrimID[0];
                          local_820 = uStack_81c;
                          uStack_818 = uStack_81c;
                          uStack_814 = uStack_81c;
                          uStack_810 = uStack_81c;
                          uStack_80c = uStack_81c;
                          uStack_808 = uStack_81c;
                          uStack_804 = uStack_81c;
                          local_ae0 = local_980._0_8_;
                          uStack_ad8 = local_980._8_8_;
                          uStack_ad0 = local_980._16_8_;
                          uStack_ac8 = local_980._24_8_;
                          local_b50.valid = (int *)&local_ae0;
                          local_b50.geometryUserPtr = pGVar12->userPtr;
                          local_b50.ray = (RTCRayN *)ray;
                          local_b50.hit = (RTCHitN *)&local_920;
                          local_b50.N = 8;
                          local_b50.context = local_c70;
                          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar12->occlusionFilterN)(&local_b50);
                            uVar36 = local_c80;
                            uVar37 = local_c88;
                            uVar39 = local_c90;
                            uVar40 = local_c98;
                            uVar41 = local_ca0;
                            uVar42 = local_ca8;
                          }
                          auVar28._8_8_ = uStack_ad8;
                          auVar28._0_8_ = local_ae0;
                          auVar28._16_8_ = uStack_ad0;
                          auVar28._24_8_ = uStack_ac8;
                          if (auVar28 == (undefined1  [32])0x0) {
                            auVar133 = ZEXT1664(local_c10);
                            auVar134 = ZEXT1664(local_c20);
                            auVar135 = ZEXT1664(local_c30);
                            auVar136 = ZEXT1664(local_c40);
                            auVar137 = ZEXT1664(local_c50);
                            auVar138 = ZEXT1664(local_c60);
                          }
                          else {
                            p_Var17 = context->args->filter;
                            auVar133 = ZEXT1664(local_c10);
                            auVar134 = ZEXT1664(local_c20);
                            auVar135 = ZEXT1664(local_c30);
                            auVar136 = ZEXT1664(local_c40);
                            auVar137 = ZEXT1664(local_c50);
                            auVar138 = ZEXT1664(local_c60);
                            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var17)(&local_b50);
                              auVar138 = ZEXT1664(local_c60);
                              auVar137 = ZEXT1664(local_c50);
                              auVar136 = ZEXT1664(local_c40);
                              auVar135 = ZEXT1664(local_c30);
                              auVar134 = ZEXT1664(local_c20);
                              auVar133 = ZEXT1664(local_c10);
                              uVar36 = local_c80;
                              uVar37 = local_c88;
                              uVar39 = local_c90;
                              uVar40 = local_c98;
                              uVar41 = local_ca0;
                              uVar42 = local_ca8;
                            }
                            auVar29._8_8_ = uStack_ad8;
                            auVar29._0_8_ = local_ae0;
                            auVar29._16_8_ = uStack_ad0;
                            auVar29._24_8_ = uStack_ac8;
                            uVar31 = vptestmd_avx512vl(auVar29,auVar29);
                            auVar88 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar18 = (bool)((byte)uVar31 & 1);
                            auVar90._0_4_ =
                                 (uint)bVar18 * auVar88._0_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x100);
                            bVar18 = (bool)((byte)(uVar31 >> 1) & 1);
                            auVar90._4_4_ =
                                 (uint)bVar18 * auVar88._4_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x104);
                            bVar18 = (bool)((byte)(uVar31 >> 2) & 1);
                            auVar90._8_4_ =
                                 (uint)bVar18 * auVar88._8_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x108);
                            bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
                            auVar90._12_4_ =
                                 (uint)bVar18 * auVar88._12_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x10c);
                            bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                            auVar90._16_4_ =
                                 (uint)bVar18 * auVar88._16_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x110);
                            bVar18 = (bool)((byte)(uVar31 >> 5) & 1);
                            auVar90._20_4_ =
                                 (uint)bVar18 * auVar88._20_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x114);
                            bVar18 = (bool)((byte)(uVar31 >> 6) & 1);
                            auVar90._24_4_ =
                                 (uint)bVar18 * auVar88._24_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x118);
                            bVar18 = SUB81(uVar31 >> 7,0);
                            auVar90._28_4_ =
                                 (uint)bVar18 * auVar88._28_4_ |
                                 (uint)!bVar18 * *(int *)(local_b50.ray + 0x11c);
                            *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar90;
                            if (auVar29 != (undefined1  [32])0x0) {
                              if ((local_cc0 & 1) == 0) goto LAB_008094d1;
                              break;
                            }
                          }
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_cbc;
                          uVar31 = local_cb0 & 0x3f;
                          local_cb0 = 0;
                          local_c78 = local_c78 ^ 1L << uVar31;
                          for (uVar31 = local_c78; (uVar31 & 1) == 0;
                              uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                            local_cb0 = local_cb0 + 1;
                          }
                          local_cc0 = CONCAT31(local_cc0._1_3_,local_c78 == 0);
                        } while (local_c78 != 0);
                      }
                    }
                  }
                }
              }
              local_bd0 = local_bd0 - 1 & local_bd0;
              auVar131 = ZEXT1664(local_b90);
              auVar132 = ZEXT1664(local_ba0);
              sVar43 = k;
              pRVar46 = ray;
              fVar98 = local_b60;
              fVar92 = fStack_b5c;
              fVar93 = fStack_b58;
              fVar94 = fStack_b54;
              fVar49 = local_b70;
              fVar95 = fStack_b6c;
              fVar96 = fStack_b68;
              fVar99 = fStack_b64;
              fVar91 = local_b80;
              fVar100 = fStack_b7c;
              fVar101 = fStack_b78;
              fVar102 = fStack_b74;
            } while (local_bd0 != 0);
          }
          local_bc8 = local_bc8 + 1;
          bVar47 = local_bc8 < local_be8;
        } while (local_bc8 != local_be8);
      }
LAB_008094fe:
      uVar30 = 0;
      if (bVar47) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar30 = 1;
      }
    }
  } while ((uVar30 & 3) == 0);
  return local_ba8 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }